

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
FileTokenizer::createToken(FileTokenizer *this,TokenType type,size_t length,double value)

{
  string local_48;
  double local_28;
  double value_local;
  size_t length_local;
  FileTokenizer *pFStack_10;
  TokenType type_local;
  FileTokenizer *this_local;
  
  (this->token).type = type;
  (this->token).line = this->lineNumber;
  (this->token).column = this->linePos + 1;
  local_28 = value;
  value_local = (double)length;
  length_local._4_4_ = type;
  pFStack_10 = this;
  std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->currentLine);
  Token::setValue<double>(&this->token,value,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->linePos = (long)value_local + this->linePos;
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length, double value)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;
	token.setValue(value, currentLine.substr(linePos, length));

	linePos += length;
}